

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O0

void __thiscall
Imf_2_5::TypedDeepImageChannel<unsigned_int>::resize(TypedDeepImageChannel<unsigned_int> *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  ImageChannel *in_RDI;
  
  DeepImageChannel::resize((DeepImageChannel *)0x12be67);
  if (in_RDI[1]._vptr_ImageChannel != (_func_int **)0x0) {
    operator_delete__(in_RDI[1]._vptr_ImageChannel);
  }
  in_RDI[1]._vptr_ImageChannel = (_func_int **)0x0;
  sVar2 = ImageChannel::numPixels(in_RDI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pp_Var4 = (_func_int **)operator_new__(uVar3);
  in_RDI[1]._vptr_ImageChannel = pp_Var4;
  (*in_RDI->_vptr_ImageChannel[8])();
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::resize ()
{
    DeepImageChannel::resize();

    delete [] _sampleListPointers;
    _sampleListPointers = 0;
    _sampleListPointers = new T * [numPixels()];
    initializeSampleLists();
}